

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_utils_leb128.c
# Opt level: O2

size_t lj_utils_write_uleb128(uint8_t *buffer,uint64_t value)

{
  size_t sVar1;
  
  sVar1 = 1;
  for (; 0x7f < value; value = value >> 7) {
    buffer[sVar1 - 1] = (byte)value | 0x80;
    sVar1 = sVar1 + 1;
  }
  buffer[sVar1 - 1] = (byte)value;
  return sVar1;
}

Assistant:

size_t LJ_FASTCALL lj_utils_write_uleb128(uint8_t *buffer, uint64_t value)
{
  size_t i = 0;

  for (; value >= MIN_TWOBYTE_VALUE; value >>= SHIFT_STEP)
    buffer[i++] = (uint8_t)((value & PAYLOAD_MASK) | LINK_BIT);

  buffer[i++] = (uint8_t)value;

  lj_assertX(i <= LEB128_U64_MAXSIZE, "bad uleb128 size");

  return i;
}